

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

MemberInfo **
kj::_::
CopyConstructArray_<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_**,_true,_false>
::apply(MemberInfo **pos,MemberInfo **start,MemberInfo **end)

{
  MemberInfo **params;
  MemberInfo **end_local;
  MemberInfo **start_local;
  MemberInfo **pos_local;
  
  end_local = start;
  start_local = pos;
  while (end_local != end) {
    params = mv<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>(end_local);
    ctor<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>
              (start_local,params);
    end_local = end_local + 1;
    start_local = start_local + 1;
  }
  return start_local;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }